

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# library.cpp
# Opt level: O3

Book * __thiscall
Library::checkout_book(Book *__return_storage_ptr__,Library *this,Patron *patron,string *isbn)

{
  Book *pBVar1;
  _Alloc_hider _Var2;
  Book *pBVar3;
  int iVar4;
  long *plVar5;
  undefined8 uVar6;
  size_type *psVar7;
  Book *this_00;
  bool bVar8;
  string local_88;
  Library *local_68;
  Patron *local_60;
  Book *local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  this_00 = *(Book **)&this->books;
  pBVar1 = *(Book **)&this->field_0x20;
  local_58 = __return_storage_ptr__;
  local_68 = this;
  local_60 = patron;
  while( true ) {
    if (this_00 == pBVar1) {
      std::operator+(&local_50,"Error in Library::checkout_book() - Book with ISBN=",isbn);
      plVar5 = (long *)std::__cxx11::string::append((char *)&local_50);
      local_88._M_dataplus._M_p = (pointer)*plVar5;
      psVar7 = (size_type *)(plVar5 + 2);
      if ((size_type *)local_88._M_dataplus._M_p == psVar7) {
        local_88.field_2._M_allocated_capacity = *psVar7;
        local_88.field_2._8_8_ = plVar5[3];
        local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
      }
      else {
        local_88.field_2._M_allocated_capacity = *psVar7;
      }
      local_88._M_string_length = plVar5[1];
      *plVar5 = (long)psVar7;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      error(&local_88);
      std::__cxx11::string::~string((string *)&local_88);
      uVar6 = std::__cxx11::string::~string((string *)&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88._M_dataplus._M_p != &local_88.field_2) {
        operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      _Unwind_Resume(uVar6);
    }
    Book::get_isbn_abi_cxx11_(&local_88,this_00);
    _Var2._M_p = local_88._M_dataplus._M_p;
    if (local_88._M_string_length == isbn->_M_string_length) {
      if (local_88._M_string_length == 0) {
        bVar8 = true;
      }
      else {
        iVar4 = bcmp(local_88._M_dataplus._M_p,(isbn->_M_dataplus)._M_p,local_88._M_string_length);
        bVar8 = iVar4 == 0;
      }
    }
    else {
      bVar8 = false;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_Var2._M_p != &local_88.field_2) {
      operator_delete(_Var2._M_p,local_88.field_2._M_allocated_capacity + 1);
    }
    pBVar3 = local_58;
    if (bVar8) break;
    this_00 = this_00 + 1;
  }
  checkout_book(local_58,local_68,local_60,this_00);
  return pBVar3;
}

Assistant:

Book Library::checkout_book(const Patron& patron, const std::string& isbn)
{
	for (const auto& book : books)
		if (book.get_isbn() == isbn)
			return checkout_book(patron, book);
	error("Error in Library::checkout_book() - Book with ISBN="
		+ isbn + " not found.");
}